

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatWalk.cpp
# Opt level: O3

void __thiscall FatWalk::walk(FatWalk *this,int cluster)

{
  FatSystem *this_00;
  long lVar1;
  undefined8 *puVar2;
  char *pcVar3;
  byte bVar4;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  FatEntry root;
  string local_1c8;
  long *local_1a8 [2];
  long local_198 [2];
  undefined1 local_188 [32];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined8 local_148 [9];
  bool local_100;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  char *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_98 [4];
  uint local_94;
  bool local_50;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  bVar4 = 0;
  FatEntry::FatEntry((FatEntry *)local_d8);
  this_00 = (this->super_FatModule).system;
  if (this_00->rootDirectory == (long)cluster) {
    FatSystem::rootEntry((FatEntry *)local_188,this_00);
    std::__cxx11::string::operator=((string *)local_d8,(string *)local_188);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_168);
    puVar2 = local_148;
    pcVar3 = local_98;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pcVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      pcVar3 = pcVar3 + ((ulong)bVar4 * -2 + 1) * 8;
    }
    local_50 = local_100;
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p != &local_158) {
      operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
      operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
    }
  }
  else {
    local_98[0] = '\x10';
    local_94 = cluster;
    std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x116a0f);
  }
  local_188._24_8_ = local_188 + 8;
  local_188._8_4_ = _S_red;
  local_188._16_8_ = 0;
  local_160 = 0;
  local_1a8[0] = local_198;
  local_168._M_p = (pointer)local_188._24_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/","");
  (*this->_vptr_FatWalk[1])(this,local_d8,local_d8,local_1a8);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"/","");
  doWalk(this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_188,(FatEntry *)local_d8,
         &local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  return;
}

Assistant:

void FatWalk::walk(int cluster)
{
    FatEntry root;

    if (cluster == system.rootDirectory) {
        root = system.rootEntry();
    } else {
        root.cluster = cluster;
        root.attributes = FAT_ATTRIBUTES_DIR;
        root.longName = "/";
    }
    set<int> visited;
    onEntry(root, root, "/");
    doWalk(visited, root, "/");
}